

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simultan.c
# Opt level: O1

int nonlin_common(Item *q4,int sensused)

{
  Symbol *s;
  bool bVar1;
  int iVar2;
  long lVar3;
  uint indx;
  uint uVar4;
  char *pcVar5;
  List *pLVar6;
  
  lVar3 = 0x41;
  indx = 0;
  bVar1 = false;
  do {
    pLVar6 = symlist[lVar3]->next;
    if (pLVar6 != symlist[lVar3]) {
      do {
        s = (pLVar6->element).sym;
        if (((s->subtype & 0x10) != 0) && (s->used != 0)) {
          s->varnum = indx;
          slist_data(s,indx,numlist);
          if ((s->subtype & 0x20) == 0) {
            sprintf(buf,"_slist%d[%d] = &(%s) - _p;\n",(ulong)(uint)numlist,(ulong)indx,s->name);
            uVar4 = 1;
          }
          else {
            uVar4 = s->araydim;
            sprintf(buf,"for(_i=0;_i<%d;_i++){_slist%d[%d+_i] = (%s + _i) - _p;}\n",(ulong)uVar4,
                    (ulong)(uint)numlist,(ulong)indx,s->name);
            bVar1 = true;
          }
          indx = uVar4 + indx;
          lappendstr(initlist,buf);
          s->used = 0;
          if (sensused != 0) {
            add_sens_statelist(s);
          }
        }
        pLVar6 = pLVar6->next;
      } while (pLVar6 != symlist[lVar3]);
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x7b);
  pLVar6 = eqnq->next;
  if (pLVar6 == eqnq) {
    uVar4 = 0;
  }
  else {
    uVar4 = 0;
    do {
      lVar3 = ((pLVar6->element).sym)->subtype;
      pcVar5 = *(char **)(lVar3 + 0x48);
      iVar2 = strcmp(pcVar5,"~+");
      if (iVar2 == 0) {
        if (uVar4 == 0xffffffff) {
          diag("no previous equation for adding terms",(char *)0x0);
        }
        pcVar5 = "_dlist%d[_counte] +=";
LAB_00117cc1:
        sprintf(buf,pcVar5,(ulong)(uint)numlist);
      }
      else {
        if (*pcVar5 == 'D') {
          uVar4 = uVar4 + *(int *)(lVar3 + 0x38);
          pcVar5 = "_dlist%d[(++_counte)*_STRIDE] =";
          goto LAB_00117cc1;
        }
        sprintf(buf,"_dlist%d[(++_counte)*_STRIDE] =",(ulong)(uint)numlist);
        uVar4 = uVar4 + 1;
      }
      replacstr((pLVar6->element).itm,buf);
      pLVar6 = pLVar6->next;
    } while (pLVar6 != eqnq);
  }
  if (bVar1) {
    sprintf(buf,
            "if(_counte != %d) printf( \"Number of equations, %%d, does not equal number of states, %d\", _counte + 1);\n"
            ,(ulong)(indx - 1),(ulong)indx);
    insertstr(q4,buf);
  }
  else if (uVar4 != indx) {
    sprintf(buf,"Number of equations, %d, does not equal number, %d",(ulong)uVar4,(ulong)indx);
    diag(buf," of states used");
  }
  if (uVar4 != 0) {
    freelist(&eqnq);
    sprintf(buf,"_slist%d",(ulong)(uint)numlist);
    add_global_var("int",buf,0,1,(sens_parm + 1) * indx,1);
    return indx;
  }
  diag("NONLINEAR contains no equations",(char *)0x0);
}

Assistant:

static int nonlin_common(q4, sensused)	/* used by massagenonlin() and mixed_eqns() */
	Item *q4;
	int sensused;
{
	Item *lq, *qs, *q;
	int i, counts = 0, counte = 0, using_array;
	Symbol *s;

	using_array=0;

	counts =0;
	SYMITER_STAT {
		if (s->used) {
			if (s->subtype & ARRAY) {int dim = s->araydim;
				counts += dim;
			}else{
				counts++;
			}
		}
	}

	counts = 0;
	SYMITER_STAT {
		if (s->used) {
			s->varnum = counts;
#if CVODE
			slist_data(s, counts, numlist);
#endif
			if (s->subtype & ARRAY) {int dim = s->araydim;
				using_array=1;
		        	Sprintf(buf, "for(_i=0;_i<%d;_i++){_slist%d[%d+_i] = (%s + _i) - _p;}\n"
			                ,dim, numlist , counts, s->name);
				counts += dim;
			}else{
				Sprintf(buf, "_slist%d[%d] = &(%s) - _p;\n",
					numlist, counts, s->name);
				counts++;
			}
		        Lappendstr(initlist, buf);
			s->used = 0;
			if (sensused) {
				add_sens_statelist(s);
			}
		}
	}

	ITERATE(lq, eqnq) {
		char *eqtype = SYM(ITM(lq))->name;
		if (strcmp(eqtype, "~+") == 0) { /* add equation to previous */
			if (counte == -1) {
				diag("no previous equation for adding terms", (char *)0);
			}
			Sprintf(buf, "_dlist%d[_counte] +=", numlist);
		} else if (eqtype[0] == 'D') {
			/* derivative equations using implicit method */
			int count_deriv = SYM(ITM(lq))->araydim;
			Sprintf(buf, "_dlist%d[(++_counte)*_STRIDE] =", numlist);
			counte += count_deriv;
		}else{
			Sprintf(buf, "_dlist%d[(++_counte)*_STRIDE] =", numlist);
			counte++;
		}
		replacstr(ITM(lq), buf);
	}
	if (!using_array) {
		if(counte != counts) {
Sprintf(buf ,"Number of equations, %d, does not equal number, %d", counte, counts);
			diag(buf, " of states used");
		}
	} else {
#if 1	/* can give message when running */
Sprintf(buf, "if(_counte != %d) printf( \"Number of equations, %%d,\
 does not equal number of states, %d\", _counte + 1);\n",
			counts-1, counts);
		Insertstr(q4, buf);
#endif
	}
	if (counte == 0) {
		diag("NONLINEAR contains no equations", (char *)0);
	}
	freeqnqueue();
	Sprintf(buf, "_slist%d", numlist);
	add_global_var("int", buf, 0, 1, counts*(1 + sens_parm), 1);
	return counts;
}